

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond.c
# Opt level: O3

void resp0_pipe_send_cb(void *arg)

{
  nni_aio *aio;
  nni_mtx *mtx;
  nni_aio *aio_00;
  nng_err nVar1;
  nni_msg *pnVar2;
  void *item;
  size_t count;
  
  mtx = *(nni_mtx **)((long)arg + 8);
  aio = (nni_aio *)((long)arg + 0x30);
  nVar1 = nni_aio_result(aio);
  if (nVar1 != NNG_OK) {
    pnVar2 = nni_aio_get_msg(aio);
    nni_msg_free(pnVar2);
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    nni_pipe_close(*arg);
    return;
  }
  nni_mtx_lock(mtx);
  *(undefined1 *)((long)arg + 0x10) = 0;
  item = nni_list_first((nni_list *)((long)arg + 0x18));
  if (item != (void *)0x0) {
    nni_list_remove((nni_list *)((long)arg + 0x18),item);
    aio_00 = *(nni_aio **)((long)item + 0x18);
    *(undefined8 *)((long)item + 0x10) = 0;
    *(undefined8 *)((long)item + 0x18) = 0;
    *(undefined1 *)((long)arg + 0x10) = 1;
    pnVar2 = nni_aio_get_msg(aio_00);
    count = nni_msg_len(pnVar2);
    nni_aio_set_msg(aio_00,(nni_msg *)0x0);
    nni_aio_set_msg(aio,pnVar2);
    nni_pipe_send(*arg,aio);
    nni_mtx_unlock(mtx);
    nni_aio_finish_sync(aio_00,NNG_OK,count);
    return;
  }
  if (*(int *)((long)arg + 0x14) == *(int *)((long)&mtx[2].mtx + 0x20)) {
    nni_pollable_raise((nni_pollable *)&mtx[7].mtx.__data.__list.__next);
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
resp0_pipe_send_cb(void *arg)
{
	resp0_pipe *p = arg;
	resp0_sock *s = p->psock;
	resp0_ctx  *ctx;
	nni_aio    *aio;
	nni_msg    *msg;
	size_t      len;

	if (nni_aio_result(&p->aio_send) != 0) {
		nni_msg_free(nni_aio_get_msg(&p->aio_send));
		nni_aio_set_msg(&p->aio_send, NULL);
		nni_pipe_close(p->npipe);
		return;
	}
	nni_mtx_lock(&s->mtx);
	p->busy = false;
	if ((ctx = nni_list_first(&p->sendq)) == NULL) {
		// Nothing else to send.
		if (p->id == s->ctx.pipe_id) {
			// Mark us ready for the other side to send!
			nni_pollable_raise(&s->writable);
		}
		nni_mtx_unlock(&s->mtx);
		return;
	}

	nni_list_remove(&p->sendq, ctx);
	aio        = ctx->saio;
	ctx->saio  = NULL;
	ctx->spipe = NULL;
	p->busy    = true;
	msg        = nni_aio_get_msg(aio);
	len        = nni_msg_len(msg);
	nni_aio_set_msg(aio, NULL);
	nni_aio_set_msg(&p->aio_send, msg);
	nni_pipe_send(p->npipe, &p->aio_send);

	nni_mtx_unlock(&s->mtx);

	nni_aio_finish_sync(aio, 0, len);
}